

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O3

int big_record_view_field(BigRecordType *rtype,int i,BigArray *array,size_t size,void *buf)

{
  BigRecordField *pBVar1;
  int iVar2;
  ptrdiff_t strides [2];
  size_t dims [2];
  size_t local_28;
  long local_20;
  size_t local_18;
  long local_10;
  
  pBVar1 = rtype->fields;
  local_10 = (long)pBVar1[i].nmemb;
  local_28 = rtype->itemsize;
  local_20 = (long)pBVar1[i].elsize;
  local_18 = size;
  iVar2 = big_array_init(array,(void *)((long)pBVar1[i].offset + (long)buf),pBVar1[i].dtype,2,
                         &local_18,(ptrdiff_t *)&local_28);
  return iVar2;
}

Assistant:

int
big_record_view_field(const BigRecordType * rtype,
    int i,
    BigArray * array,
    size_t size,
    void * buf
)
{
    char * p = buf;
    size_t dims[2] = { size, rtype->fields[i].nmemb };
    ptrdiff_t strides[2] = { rtype->itemsize, rtype->fields[i].elsize };
    return big_array_init(array, &p[rtype->fields[i].offset],
                          rtype->fields[i].dtype,
                          2, dims, strides);
}